

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

BindingFrame * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::capture
          (BindingFrame *__return_storage_ptr__,Interpreter *this,
          vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
          *free_vars)

{
  _Rb_tree_header *p_Var1;
  pointer ppIVar2;
  HeapThunk *pHVar3;
  mapped_type *ppHVar4;
  pointer ppIVar5;
  Identifier *fv;
  Identifier *local_38;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppIVar5 = (free_vars->
            super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppIVar2 = (free_vars->
            super__Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppIVar5 != ppIVar2) {
    do {
      local_38 = *ppIVar5;
      pHVar3 = Stack::lookUpVar(&this->stack,local_38);
      ppHVar4 = std::
                map<const_jsonnet::internal::Identifier_*,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<std::pair<const_jsonnet::internal::Identifier_*const,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                ::operator[](__return_storage_ptr__,&local_38);
      *ppHVar4 = pHVar3;
      ppIVar5 = ppIVar5 + 1;
    } while (ppIVar5 != ppIVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

BindingFrame capture(const std::vector<const Identifier *> &free_vars)
    {
        BindingFrame env;
        for (auto fv : free_vars) {
            auto *th = stack.lookUpVar(fv);
            env[fv] = th;
        }
        return env;
    }